

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialTransaction::SetTxOutValue
          (ConfidentialTransaction *this,uint32_t index,Amount *value)

{
  long lVar1;
  pointer pCVar2;
  ulong uVar3;
  pointer puVar4;
  void *pvVar5;
  CfdException *pCVar6;
  undefined4 in_register_00000034;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ConfidentialValue ct_value;
  undefined1 local_90 [32];
  byte local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uVar3 = (ulong)index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,CONCAT44(in_register_00000034,index),0x8d6,"SetTxOutValue");
  pvVar5 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if (pvVar5 == (void *)0x0) {
    return;
  }
  lVar9 = uVar3 * 0x70 + *(long *)((long)pvVar5 + 0x20);
  ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_90,
             &(this->vout_).
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar3].confidential_value_);
  if (local_70 < 2) {
    lVar1 = *(long *)(lVar9 + 0x38);
    local_90._0_8_ = &PTR__ConfidentialValue_006a2070;
    if ((void *)CONCAT44(local_90._12_4_,local_90._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_90._12_4_,local_90._8_4_));
    }
    if (lVar1 != 0x21) {
      ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_90,value);
      local_68._0_8_ = (pointer)0x0;
      local_68._8_8_ = (pointer)0x0;
      local_58._M_allocated_capacity = 0;
      uVar7 = local_90._16_8_ - CONCAT44(local_90._12_4_,local_90._8_4_);
      if (uVar7 == 0) {
        puVar4 = (pointer)0x0;
      }
      else {
        if ((long)uVar7 < 0) {
          ::std::__throw_bad_alloc();
        }
        puVar4 = (pointer)operator_new(uVar7);
      }
      local_58._M_allocated_capacity = (size_type)(puVar4 + uVar7);
      sVar8 = local_90._16_8_ - (long)CONCAT44(local_90._12_4_,local_90._8_4_);
      local_68._0_8_ = puVar4;
      if (sVar8 != 0) {
        local_68._8_8_ = puVar4;
        memmove(puVar4,(void *)CONCAT44(local_90._12_4_,local_90._8_4_),sVar8);
      }
      local_68._8_8_ = puVar4 + sVar8;
      ByteData::GetBytes(&local_48,(ByteData *)local_68);
      if ((pointer)local_68._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_68._0_8_);
      }
      pvVar5 = *(void **)(lVar9 + 0x30);
      sVar8 = *(size_t *)(lVar9 + 0x38);
      puVar4 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (sVar8 != (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) {
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        puVar4 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar8 = (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        pvVar5 = malloc(sVar8);
        *(void **)(lVar9 + 0x30) = pvVar5;
        if (pvVar5 == (void *)0x0) {
          local_68._0_8_ = "cfdcore_elements_transaction.cpp";
          local_68._8_4_ = 0x8ea;
          local_58._M_allocated_capacity = 0x599e98;
          logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"malloc fail.");
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          local_68._0_8_ = &local_58;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"malloc fail.","");
          CfdException::CfdException(pCVar6,kCfdMemoryFullError,(string *)local_68);
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
        *(size_t *)(lVar9 + 0x38) = sVar8;
      }
      memcpy(pvVar5,puVar4,sVar8);
      pCVar2 = (this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (*pCVar2[uVar3].super_AbstractTxOut._vptr_AbstractTxOut[2])(pCVar2 + uVar3,value);
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_90._0_8_ = &PTR__ConfidentialValue_006a2070;
      if ((void *)CONCAT44(local_90._12_4_,local_90._8_4_) == (void *)0x0) {
        return;
      }
      operator_delete((void *)CONCAT44(local_90._12_4_,local_90._8_4_));
      return;
    }
  }
  else {
    local_90._0_8_ = &PTR__ConfidentialValue_006a2070;
    if ((void *)CONCAT44(local_90._12_4_,local_90._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_90._12_4_,local_90._8_4_));
    }
  }
  local_90._0_8_ = "cfdcore_elements_transaction.cpp";
  local_90._8_4_ = 0x8de;
  local_90._16_8_ = "SetTxOutValue";
  logger::log<>((CfdSourceLocation *)local_90,kCfdLogLevelWarning,"value is already blinded.");
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_90._0_8_ = local_90 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"value is already blinded.","");
  CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_90);
  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::SetTxOutValue(
    uint32_t index, const Amount &value) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    struct wally_tx_output *output = tx_pointer->outputs + index;
    if (vout_[index].GetConfidentialValue().HasBlinding() ||
        (output->value_len == kConfidentialDataSize)) {
      warn(CFD_LOG_SOURCE, "value is already blinded.");
      throw CfdException(kCfdIllegalStateError, "value is already blinded.");
    }

    ConfidentialValue ct_value(value);
    const std::vector<uint8_t> &value_data = ct_value.GetData().GetBytes();
    if (output->value_len == value_data.size()) {
      memcpy(output->value, value_data.data(), output->value_len);
    } else {
      if (output->value != nullptr) free(output->value);
      output->value = (unsigned char *)malloc(value_data.size());
      if (output->value == nullptr) {
        warn(CFD_LOG_SOURCE, "malloc fail.");
        throw CfdException(kCfdMemoryFullError, "malloc fail.");
      }
      output->value_len = value_data.size();
      memcpy(output->value, value_data.data(), output->value_len);
    }

    vout_[index].SetValue(value);
    // CallbackStateChange(kStateChangeAddTxOut);
  }
}